

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O3

void __thiscall iqxmlrpc::Server::schedule_execute(Server *this,Packet *pkt,Server_connection *conn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Auth_Plugin_base *this_00;
  pointer pcVar2;
  Executor_factory_base *pEVar3;
  bool bVar4;
  int iVar5;
  Request_header *this_01;
  Method *pMVar6;
  undefined4 extraout_var;
  Unauthorized *pUVar8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  authname;
  Data mdata;
  scoped_ptr<iqxmlrpc::Request> req;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Data local_98;
  Server_connection *local_58;
  string local_50;
  long *plVar7;
  
  this_00 = this->impl->auth_plugin;
  local_58 = conn;
  if (this_00 != (Auth_Plugin_base *)0x0) {
    this_01 = (Request_header *)
              __dynamic_cast((pkt->header_).px,&http::Header::typeinfo,
                             &http::Request_header::typeinfo,0);
    if (this_01 == (Request_header *)0x0) {
      __cxa_bad_cast();
    }
    bVar4 = http::Request_header::has_authinfo(this_01);
    if (bVar4) {
      paVar1 = &local_98.method_name.field_2;
      local_98.method_name._M_string_length = 0;
      local_98.method_name.field_2._M_local_buf[0] = '\0';
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_98.method_name._M_dataplus._M_p = (pointer)paVar1;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      http::Request_header::get_authinfo(this_01,&local_98.method_name,&local_50);
      bVar4 = Auth_Plugin_base::authenticate(this_00,&local_98.method_name,&local_50);
      if (!bVar4) {
        pUVar8 = (Unauthorized *)__cxa_allocate_exception(0x50);
        http::Unauthorized::Unauthorized(pUVar8);
        __cxa_throw(pUVar8,&http::Unauthorized::typeinfo,http::Error_response::~Error_response);
      }
      local_b8 = &local_a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.method_name._M_dataplus._M_p == paVar1) {
        local_a8._8_8_ = local_98.method_name.field_2._8_8_;
      }
      else {
        local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_98.method_name._M_dataplus._M_p;
      }
      local_a8._M_allocated_capacity._1_7_ =
           local_98.method_name.field_2._M_allocated_capacity._1_7_;
      local_a8._M_local_buf[0] = local_98.method_name.field_2._M_local_buf[0];
      local_98.method_name._M_string_length = 0;
      local_98.method_name.field_2._M_local_buf[0] = '\0';
      bVar4 = true;
      local_98.method_name._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.method_name._M_dataplus._M_p != paVar1) {
          operator_delete(local_98.method_name._M_dataplus._M_p,
                          CONCAT71(local_98.method_name.field_2._M_allocated_capacity._1_7_,
                                   local_98.method_name.field_2._M_local_buf[0]) + 1);
        }
      }
      goto LAB_00166375;
    }
    bVar4 = Auth_Plugin_base::authenticate_anonymous(this_00);
    if (!bVar4) {
      pUVar8 = (Unauthorized *)__cxa_allocate_exception(0x50);
      http::Unauthorized::Unauthorized(pUVar8);
      __cxa_throw(pUVar8,&http::Unauthorized::typeinfo,http::Error_response::~Error_response);
    }
  }
  bVar4 = false;
LAB_00166375:
  local_50._M_dataplus._M_p = (pointer)parse_request(&pkt->content_);
  if ((Request *)local_50._M_dataplus._M_p != (Request *)0x0) {
    paVar1 = &local_98.method_name.field_2;
    pcVar2 = (((Request *)local_50._M_dataplus._M_p)->name)._M_dataplus._M_p;
    local_98.method_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,
               pcVar2 + (((Request *)local_50._M_dataplus._M_p)->name)._M_string_length);
    local_98.peer_addr._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_00187f48;
    local_98.peer_addr.impl_.px = (local_58->peer_addr).impl_.px;
    local_98.peer_addr.impl_.pn.pi_ = (local_58->peer_addr).impl_.pn.pi_;
    if (local_98.peer_addr.impl_.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_98.peer_addr.impl_.pn.pi_)->use_count_ =
           (local_98.peer_addr.impl_.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_98.server_face.server_ = this;
    pMVar6 = Method_dispatcher_manager::create_method(&this->impl->disp_manager,&local_98);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&pMVar6->authname_);
    }
    http::Header::get_xheaders((pkt->header_).px,&pMVar6->xheaders_);
    pEVar3 = this->impl->exec_factory;
    iVar5 = (*pEVar3->_vptr_Executor_factory_base[2])(pEVar3,pMVar6,this,local_58);
    plVar7 = (long *)CONCAT44(extraout_var,iVar5);
    plVar7[2] = (long)(this->impl->interceptors)._M_ptr;
    if ((Request *)local_50._M_dataplus._M_p != (Request *)0x0) {
      (**(code **)(*plVar7 + 0x10))(plVar7,(Param_list *)(local_50._M_dataplus._M_p + 0x20));
      local_98.peer_addr._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_00187f48;
      boost::detail::shared_count::~shared_count(&local_98.peer_addr.impl_.pn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.method_name._M_dataplus._M_p != paVar1) {
        operator_delete(local_98.method_name._M_dataplus._M_p,
                        CONCAT71(local_98.method_name.field_2._M_allocated_capacity._1_7_,
                                 local_98.method_name.field_2._M_local_buf[0]) + 1);
      }
      boost::scoped_ptr<iqxmlrpc::Request>::~scoped_ptr((scoped_ptr<iqxmlrpc::Request> *)&local_50);
      if ((bVar4) && (local_b8 != &local_a8)) {
        operator_delete(local_b8,local_a8._M_allocated_capacity + 1);
      }
      (*pkt->_vptr_Packet[1])(pkt);
      return;
    }
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/scoped_ptr.hpp",0x69,
                "T *boost::scoped_ptr<iqxmlrpc::Request>::operator->() const [T = iqxmlrpc::Request]"
               );
}

Assistant:

void Server::schedule_execute( http::Packet* pkt, Server_connection* conn )
{
  using boost::scoped_ptr;
  using boost::optional;

  Executor* executor = 0;

  try {
    scoped_ptr<http::Packet> packet(pkt);
    optional<std::string> authname = authenticate(*pkt, impl->auth_plugin);
    scoped_ptr<Request> req( parse_request(packet->content()) );

    Method::Data mdata = {
      req->get_name(),
      conn->get_peer_addr(),
      Server_feedback(this)
    };

    Method* meth = impl->disp_manager.create_method( mdata );

    if (authname)
      meth->authname(authname.get());

    pkt->header()->get_xheaders(meth->xheaders());

    executor = impl->exec_factory->create( meth, this, conn );
    executor->set_interceptors(impl->interceptors.get());
    executor->execute( req->get_params() );
  }
  catch( const iqxmlrpc::http::Error_response& e )
  {
    log_err_msg( e.what() );
    std::auto_ptr<Executor> executor_to_delete(executor);
    http::Packet *pkt = new http::Packet(e);
    conn->schedule_response( pkt );
  }
  catch( const iqxmlrpc::Exception& e )
  {
    log_err_msg( std::string("Server: ") + e.what() );
    Response err_r( e.code(), e.what() );
    schedule_response( err_r, conn, executor );
  }
  catch( const std::exception& e )
  {
    log_err_msg( std::string("Server: ") + e.what() );
    Response err_r( -32500 /*application error*/, e.what() );
    schedule_response( err_r, conn, executor );
  }
  catch( ... )
  {
    log_err_msg( "Server: Unknown exception" );
    Response err_r( -32500  /*application error*/, "Unknown Error" );
    schedule_response( err_r, conn, executor );
  }
}